

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::SwitchAI::step(SwitchAI *this)

{
  pointer *pppTVar1;
  TrainAI *bot_00;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *pvVar7;
  Town *this_00;
  IPost *pIVar8;
  Train *pTVar9;
  pointer ppTVar10;
  pointer ppTVar11;
  pointer ppTVar12;
  ulong uVar13;
  TrainAI *bot;
  TrainAI *local_38;
  
  pvVar7 = world::World::getPlayerList(this->world);
  this_00 = (Town *)world::Player::getHome
                              (*(pvVar7->
                                super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
  iVar4 = world::Town::getPopulation(this_00);
  pvVar7 = world::World::getPlayerList(this->world);
  pIVar8 = world::Player::getHome
                     (*(pvVar7->
                       super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  iVar5 = (*pIVar8->_vptr_IPost[0xb])(pIVar8);
  iVar4 = (iVar5 + iVar4) * 0x3c + -0x3c;
  ppTVar10 = (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar11 = (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar10 != ppTVar11) {
    do {
      bot_00 = *ppTVar10;
      bVar3 = canSwitch(this,bot_00);
      if (!bVar3) {
        pTVar9 = TrainAI::getTrain(bot_00);
        iVar5 = world::Train::getGoodsCapacity(pTVar9);
        iVar4 = iVar4 - iVar5;
      }
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != ppTVar11);
    ppTVar10 = (this->productBots).
               super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->productBots).
        super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar10) {
      uVar13 = 0;
      iVar5 = 0;
      do {
        local_38 = ppTVar10[uVar13];
        bVar3 = canSwitch(this,local_38);
        if (bVar3) {
          if (iVar4 < 1) {
            ppTVar10 = (this->productBots).
                       super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppTVar11 = (this->productBots).
                       super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (8 < (ulong)((long)ppTVar11 - (long)ppTVar10)) {
              ppTVar12 = ppTVar10 + uVar13 + 1;
              if (ppTVar12 != ppTVar11) {
                memmove(ppTVar10 + uVar13,ppTVar12,(long)ppTVar11 - (long)ppTVar12);
                ppTVar11 = (this->productBots).
                           super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              }
              (this->productBots).
              super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppTVar11 + -1;
              TrainAI::changeType(local_38,ARMOR);
              iVar2._M_current =
                   (this->armorBots).
                   super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (this->armorBots).
                  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                ::_M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                          ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                            *)&this->armorBots,iVar2,&local_38);
              }
              else {
                *iVar2._M_current = local_38;
                pppTVar1 = &(this->armorBots).
                            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppTVar1 = *pppTVar1 + 1;
              }
              iVar5 = iVar5 + -1;
              goto LAB_0014ffaf;
            }
          }
          pTVar9 = TrainAI::getTrain(local_38);
          iVar6 = world::Train::getGoodsCapacity(pTVar9);
          iVar4 = iVar4 - iVar6;
        }
LAB_0014ffaf:
        iVar5 = iVar5 + 1;
        uVar13 = (ulong)iVar5;
        ppTVar10 = (this->productBots).
                   super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(this->productBots).
                                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10 >>
                               3));
    }
  }
  ppTVar10 = (this->armorBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->armorBots).
      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar10) {
    uVar13 = 0;
    iVar5 = 0;
    do {
      local_38 = ppTVar10[uVar13];
      bVar3 = canSwitch(this,local_38);
      if ((bVar3) && (0 < iVar4)) {
        ppTVar10 = (this->armorBots).
                   super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar11 = (this->armorBots).
                   super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)ppTVar11 - (long)ppTVar10) < 9) goto LAB_001500b8;
        ppTVar12 = ppTVar10 + uVar13 + 1;
        if (ppTVar12 != ppTVar11) {
          memmove(ppTVar10 + uVar13,ppTVar12,(long)ppTVar11 - (long)ppTVar12);
          ppTVar11 = (this->armorBots).
                     super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->armorBots).
        super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar11 + -1;
        TrainAI::changeType(local_38,PRODUCT);
        iVar2._M_current =
             (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->productBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>::
          _M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                    ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                      *)&this->productBots,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          pppTVar1 = &(this->productBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      else {
LAB_001500b8:
        iVar5 = iVar5 + 1;
      }
      uVar13 = (ulong)iVar5;
      ppTVar10 = (this->armorBots).
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->armorBots).
                                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10 >> 3
                             ));
  }
  return;
}

Assistant:

void SwitchAI::step()
{
    int population = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getPopulation();
    int needProductCompacity;
    int level = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getLevel();

    needProductCompacity = 60 *(population + level - 1);


    for (TrainAI *bot : productBots)
        if (!canSwitch(bot))
            needProductCompacity -= bot->getTrain()->getGoodsCapacity();


    int i = 0;

    while (i < productBots.size())
    {
        TrainAI *bot = productBots[i];

        if (canSwitch(bot))
            if (needProductCompacity > 0 || productBots.size() < 2)
                needProductCompacity -= bot->getTrain()->getGoodsCapacity();
            else
            {
                productBots.erase(productBots.begin() + i);
                bot->changeType(models::GoodType::ARMOR);
                armorBots.push_back(bot);
                i--;
            }

        i++;
    }

    i = 0;

    while (i < armorBots.size())
    {
        TrainAI *bot = armorBots[i];

        if (canSwitch(bot) && needProductCompacity > 0 && armorBots.size() > 1)
        {
            armorBots.erase(armorBots.begin() + i);
            bot->changeType(models::GoodType::PRODUCT);
            productBots.push_back(bot);
        }
        else
            i++;
    }
}